

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     Finalize<duckdb::ReservoirQuantileState<float>,float,duckdb::ReservoirQuantileScalarOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  long lVar1;
  idx_t iVar2;
  float *target;
  AggregateFinalizeData finalize_data;
  
  finalize_data.result = result;
  finalize_data.input = aggr_input_data;
  if (*states == (Vector)0x2) {
    duckdb::Vector::SetVectorType((VectorType)result);
    finalize_data.result_idx = 0;
    ReservoirQuantileScalarOperation::Finalize<float,duckdb::ReservoirQuantileState<float>>
              ((ReservoirQuantileState<float> *)**(undefined8 **)(states + 0x20),
               *(float **)(result + 0x20),&finalize_data);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    target = (float *)(offset * 4 + *(long *)(result + 0x20));
    lVar1 = *(long *)(states + 0x20);
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      finalize_data.result_idx = offset + iVar2;
      ReservoirQuantileScalarOperation::Finalize<float,duckdb::ReservoirQuantileState<float>>
                (*(ReservoirQuantileState<float> **)(lVar1 + iVar2 * 8),target,&finalize_data);
      target = target + 1;
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}